

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_stats.cpp
# Opt level: O2

string * __thiscall
duckdb::ArrayStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ArrayStats *this,BaseStatistics *stats)

{
  BaseStatistics *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  this_00 = GetChildStats((BaseStatistics *)this);
  ::std::__cxx11::string::string(local_30,"[%s]",&local_51);
  BaseStatistics::ToString_abi_cxx11_(&local_50,this_00);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string ArrayStats::ToString(const BaseStatistics &stats) {
	auto &child_stats = ArrayStats::GetChildStats(stats);
	return StringUtil::Format("[%s]", child_stats.ToString());
}